

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O0

void google::protobuf::MapTestUtil::ExpectMapsSize<proto2_unittest::TestMap>
               (TestMap *message,int size)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  TestMap *pTVar2;
  bool bVar3;
  Reflection *pRVar4;
  FieldDescriptor *pFVar5;
  char *pcVar6;
  AssertHelper local_3b0;
  Message local_3a8;
  string_view local_3a0;
  int local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_15;
  Message local_370;
  string_view local_368;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_14;
  Message local_338;
  string_view local_330;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_13;
  Message local_300;
  string_view local_2f8;
  int local_2e4;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_12;
  Message local_2c8;
  string_view local_2c0;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_11;
  Message local_290;
  string_view local_288;
  int local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_10;
  Message local_258;
  string_view local_250;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_9;
  Message local_220;
  string_view local_218;
  int local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_8;
  Message local_1e8;
  string_view local_1e0;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_7;
  Message local_1b0;
  string_view local_1a8;
  int local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_6;
  Message local_178;
  string_view local_170;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_5;
  Message local_140;
  string_view local_138;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_4;
  Message local_108;
  string_view local_100;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  Message local_d0;
  string_view local_c8;
  int local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  string_view local_90;
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  string_view local_48;
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  Descriptor *descriptor;
  TestMap *pTStack_10;
  int size_local;
  TestMap *message_local;
  
  descriptor._4_4_ = size;
  pTStack_10 = message;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )proto2_unittest::TestMap::GetDescriptor();
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,"map_int32_int32");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_48);
  local_34 = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_30,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_int32_int32\"))"
             ,(int *)((long)&descriptor + 4),&local_34);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar3) {
    testing::Message::Message(&local_50);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1e0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_90,"map_int64_int64");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_90);
  local_7c = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_78,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_int64_int64\"))"
             ,(int *)((long)&descriptor + 4),&local_7c);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar3) {
    testing::Message::Message(&local_98);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1e2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c8,"map_uint32_uint32");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_c8);
  local_b4 = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b0,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_uint32_uint32\"))"
             ,(int *)((long)&descriptor + 4),&local_b4);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar3) {
    testing::Message::Message(&local_d0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1e5,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_100,"map_uint64_uint64");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_100);
  local_ec = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e8,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_uint64_uint64\"))"
             ,(int *)((long)&descriptor + 4),&local_ec);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar3) {
    testing::Message::Message(&local_108);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1e8,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_138,"map_sint32_sint32");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_138);
  local_124 = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_120,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_sint32_sint32\"))"
             ,(int *)((long)&descriptor + 4),&local_124);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar3) {
    testing::Message::Message(&local_140);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1eb,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,"map_sint64_sint64");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_170);
  local_15c = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_158,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_sint64_sint64\"))"
             ,(int *)((long)&descriptor + 4),&local_15c);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar3) {
    testing::Message::Message(&local_178);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1ee,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,"map_fixed32_fixed32");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_1a8);
  local_194 = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_190,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_fixed32_fixed32\"))"
             ,(int *)((long)&descriptor + 4),&local_194);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar3) {
    testing::Message::Message(&local_1b0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1f1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1e0,"map_fixed64_fixed64");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_1e0);
  local_1cc = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1c8,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_fixed64_fixed64\"))"
             ,(int *)((long)&descriptor + 4),&local_1cc);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar3) {
    testing::Message::Message(&local_1e8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,500,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_218,"map_sfixed32_sfixed32");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_218);
  local_204 = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_200,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_sfixed32_sfixed32\"))"
             ,(int *)((long)&descriptor + 4),&local_204);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar3) {
    testing::Message::Message(&local_220);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1f7,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_250,"map_sfixed64_sfixed64");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_250);
  local_23c = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_238,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_sfixed64_sfixed64\"))"
             ,(int *)((long)&descriptor + 4),&local_23c);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar3) {
    testing::Message::Message(&local_258);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1fa,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_288,"map_int32_float");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_288);
  local_274 = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_270,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_int32_float\"))"
             ,(int *)((long)&descriptor + 4),&local_274);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar3) {
    testing::Message::Message(&local_290);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1fc,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2c0,"map_int32_double");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_2c0);
  local_2ac = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a8,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_int32_double\"))"
             ,(int *)((long)&descriptor + 4),&local_2ac);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar3) {
    testing::Message::Message(&local_2c8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x1ff,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2f8,"map_bool_bool");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_2f8);
  local_2e4 = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2e0,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_bool_bool\"))"
             ,(int *)((long)&descriptor + 4),&local_2e4);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar3) {
    testing::Message::Message(&local_300);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x201,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_330,"map_string_string");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_330);
  local_31c = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_318,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_string_string\"))"
             ,(int *)((long)&descriptor + 4),&local_31c);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar3) {
    testing::Message::Message(&local_338);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x204,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_368,"map_int32_bytes");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_368);
  local_354 = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_350,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_int32_bytes\"))"
             ,(int *)((long)&descriptor + 4),&local_354);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar3) {
    testing::Message::Message(&local_370);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x206,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  pRVar4 = proto2_unittest::TestMap::GetReflection();
  pTVar2 = pTStack_10;
  uVar1 = gtest_ar.message_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3a0,"map_int32_foreign_message");
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,local_3a0);
  local_38c = Reflection::FieldSize(pRVar4,&pTVar2->super_Message,pFVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_388,"size",
             "message.GetReflection()->FieldSize( message, descriptor->FindFieldByName(\"map_int32_foreign_message\"))"
             ,(int *)((long)&descriptor + 4),&local_38c);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar3) {
    testing::Message::Message(&local_3a8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x20a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  return;
}

Assistant:

void MapTestUtil::ExpectMapsSize(const TestMap& message, int size) {
  const Descriptor* descriptor = message.GetDescriptor();

  EXPECT_EQ(size, message.GetReflection()->FieldSize(
                      message, descriptor->FindFieldByName("map_int32_int32")));
  EXPECT_EQ(size, message.GetReflection()->FieldSize(
                      message, descriptor->FindFieldByName("map_int64_int64")));
  EXPECT_EQ(size,
            message.GetReflection()->FieldSize(
                message, descriptor->FindFieldByName("map_uint32_uint32")));
  EXPECT_EQ(size,
            message.GetReflection()->FieldSize(
                message, descriptor->FindFieldByName("map_uint64_uint64")));
  EXPECT_EQ(size,
            message.GetReflection()->FieldSize(
                message, descriptor->FindFieldByName("map_sint32_sint32")));
  EXPECT_EQ(size,
            message.GetReflection()->FieldSize(
                message, descriptor->FindFieldByName("map_sint64_sint64")));
  EXPECT_EQ(size,
            message.GetReflection()->FieldSize(
                message, descriptor->FindFieldByName("map_fixed32_fixed32")));
  EXPECT_EQ(size,
            message.GetReflection()->FieldSize(
                message, descriptor->FindFieldByName("map_fixed64_fixed64")));
  EXPECT_EQ(size,
            message.GetReflection()->FieldSize(
                message, descriptor->FindFieldByName("map_sfixed32_sfixed32")));
  EXPECT_EQ(size,
            message.GetReflection()->FieldSize(
                message, descriptor->FindFieldByName("map_sfixed64_sfixed64")));
  EXPECT_EQ(size, message.GetReflection()->FieldSize(
                      message, descriptor->FindFieldByName("map_int32_float")));
  EXPECT_EQ(size,
            message.GetReflection()->FieldSize(
                message, descriptor->FindFieldByName("map_int32_double")));
  EXPECT_EQ(size, message.GetReflection()->FieldSize(
                      message, descriptor->FindFieldByName("map_bool_bool")));
  EXPECT_EQ(size,
            message.GetReflection()->FieldSize(
                message, descriptor->FindFieldByName("map_string_string")));
  EXPECT_EQ(size, message.GetReflection()->FieldSize(
                      message, descriptor->FindFieldByName("map_int32_bytes")));
  EXPECT_EQ(
      size,
      message.GetReflection()->FieldSize(
          message, descriptor->FindFieldByName("map_int32_foreign_message")));
}